

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::load_ffmpeg_external
          (CImgList<unsigned_char> *this,char *filename)

{
  char *pcVar1;
  FILE *pFVar2;
  char *pcVar3;
  char *pcVar4;
  CImg<char> *pCVar5;
  CImgArgumentException *this_00;
  ulong __maxlen;
  uint uVar6;
  CImg<char> filename_tmp2;
  CImg<unsigned_char> img;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> local_50;
  
  if (filename != (char *)0x0) {
    pFVar2 = cimg::fopen(filename,"rb");
    cimg::fclose(pFVar2);
    CImg<char>::CImg(&command,0x400,1,1,1);
    CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
    CImg<char>::CImg(&filename_tmp2,0x100,1,1,1);
    while( true ) {
      pcVar1 = filename_tmp._data;
      __maxlen = (ulong)filename_tmp._width;
      pcVar3 = cimg::temporary_path((char *)0x0,false);
      pcVar4 = cimg::filenamerand();
      snprintf(pcVar1,__maxlen,"%s%c%s",pcVar3,0x2f,pcVar4);
      snprintf(filename_tmp2._data,(ulong)filename_tmp2._width,"%s_000001.ppm",filename_tmp._data);
      pFVar2 = fopen(filename_tmp2._data,"rb");
      if (pFVar2 == (FILE *)0x0) break;
      cimg::fclose(pFVar2);
    }
    snprintf(filename_tmp2._data,(ulong)filename_tmp2._width,"%s_%%6d.ppm");
    pcVar3 = command._data;
    pcVar4 = cimg::ffmpeg_path((char *)0x0,false);
    CImg<char>::string((CImg<char> *)&img,filename,true,false);
    pCVar5 = CImg<char>::_system_strescape((CImg<char> *)&img);
    pcVar1 = pCVar5->_data;
    uVar6 = 1;
    CImg<char>::string(&local_50,filename_tmp2._data,true,false);
    pCVar5 = CImg<char>::_system_strescape(&local_50);
    snprintf(pcVar3,(ulong)command._width,"%s -i \"%s\" \"%s\"",pcVar4,pcVar1,pCVar5->_data);
    CImg<char>::~CImg(&local_50);
    CImg<char>::~CImg((CImg<char> *)&img);
    cimg::system(command._data);
    cimg::exception_mode(0);
    assign(this);
    do {
      snprintf(filename_tmp2._data,(ulong)filename_tmp2._width,"%s_%.6u.ppm",filename_tmp._data,
               (ulong)uVar6);
      img._data = (uchar *)0x0;
      img._width = 0;
      img._height = 0;
      img._depth = 0;
      img._spectrum = 0;
      img._is_shared = false;
      CImg<unsigned_char>::load_pnm(&img,filename_tmp2._data);
      if (img._data != (uchar *)0x0) {
        CImg<unsigned_char>::move_to<unsigned_char>(&img,this,0xffffffff);
        remove(filename_tmp2._data);
      }
      CImg<unsigned_char>::~CImg(&img);
      uVar6 = uVar6 + 1;
    } while( true );
  }
  this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
  CImgArgumentException::CImgArgumentException
            (this_00,
             "[instance(%u,%u,%p)] CImgList<%s>::load_ffmpeg_external(): Specified filename is (null)."
             ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char");
  __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImgList<T>& load_ffmpeg_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimglist_instance
                                    "load_ffmpeg_external(): Specified filename is (null).",
                                    cimglist_instance);
      cimg::fclose(cimg::fopen(filename,"rb")); // Check if file exists
      CImg<charT> command(1024), filename_tmp(256), filename_tmp2(256);
      std::FILE *file = 0;
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        cimg_snprintf(filename_tmp2,filename_tmp2._width,"%s_000001.ppm",filename_tmp._data);
        if ((file=cimg::std_fopen(filename_tmp2,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(filename_tmp2,filename_tmp2._width,"%s_%%6d.ppm",filename_tmp._data);
      cimg_snprintf(command,command._width,"%s -i \"%s\" \"%s\"",
                    cimg::ffmpeg_path(),
                    CImg<charT>::string(filename)._system_strescape().data(),
                    CImg<charT>::string(filename_tmp2)._system_strescape().data());
      cimg::system(command,0);
      const unsigned int omode = cimg::exception_mode();
      cimg::exception_mode(0);
      assign();
      unsigned int i = 1;
      for (bool stop_flag = false; !stop_flag; ++i) {
        cimg_snprintf(filename_tmp2,filename_tmp2._width,"%s_%.6u.ppm",filename_tmp._data,i);
        CImg<T> img;
        try { img.load_pnm(filename_tmp2); }
        catch (CImgException&) { stop_flag = true; }
        if (img) { img.move_to(*this); std::remove(filename_tmp2); }
      }
      cimg::exception_mode(omode);
      if (is_empty())
        throw CImgIOException(_cimglist_instance
                              "load_ffmpeg_external(): Failed to open file '%s' with external command 'ffmpeg'.",
                              cimglist_instance,
                              filename);
      return *this;
    }